

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void EmitInvoke(RegSlot location,RegSlot callObjLocation,PropertyId propertyId,
               ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,RegSlot arg1Location)

{
  ByteCodeWriter *this;
  uint uVar1;
  bool bVar2;
  uint uVar3;
  uint16 callSiteId;
  
  EmitMethodFld(false,false,location,callObjLocation,propertyId,byteCodeGenerator,funcInfo,true);
  funcInfo->outArgsDepth = funcInfo->outArgsDepth + 1;
  uVar1 = funcInfo->outArgsCurrentExpr;
  uVar3 = uVar1 + 3;
  funcInfo->outArgsCurrentExpr = uVar3;
  if (uVar1 < 0xfffffffd) {
    if (uVar3 < funcInfo->outArgsMaxDepth) {
      uVar3 = funcInfo->outArgsMaxDepth;
    }
    funcInfo->outArgsMaxDepth = uVar3;
    this = &byteCodeGenerator->m_writer;
    bVar2 = Js::ByteCodeWriter::ShouldIncrementCallSiteId(this,CallI);
    callSiteId = byteCodeGenerator->m_callSiteId;
    if (bVar2) {
      if (callSiteId == 0xffff) {
        callSiteId = 0xffff;
      }
      else {
        byteCodeGenerator->m_callSiteId = callSiteId + 1;
      }
    }
    Js::ByteCodeWriter::StartCall(this,StartCall,2);
    if (callObjLocation != 0xffffffff) {
      Js::ByteCodeWriter::ArgOut<true>(this,0,callObjLocation,callSiteId,false);
    }
    Js::ByteCodeWriter::ArgOut<true>(this,1,arg1Location,callSiteId,false);
    Js::ByteCodeWriter::CallI(this,CallI,location,location,2,callSiteId,CallFlags_None);
    return;
  }
  Js::Throw::OutOfMemory();
}

Assistant:

void EmitInvoke(
    Js::RegSlot location,
    Js::RegSlot callObjLocation,
    Js::PropertyId propertyId,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo,
    Js::RegSlot arg1Location)
{
    EmitMethodFld(false, false, location, callObjLocation, propertyId, byteCodeGenerator, funcInfo);

    funcInfo->StartRecordingOutArgs(2);

    Js::ProfileId callSiteId = byteCodeGenerator->GetNextCallSiteId(Js::OpCode::CallI);

    byteCodeGenerator->Writer()->StartCall(Js::OpCode::StartCall, 2);
    EmitArgListStart(callObjLocation, byteCodeGenerator, funcInfo, callSiteId);
    byteCodeGenerator->Writer()->ArgOut<true>(1, arg1Location, callSiteId, false /*emitProfiledArgout*/);

    byteCodeGenerator->Writer()->CallI(Js::OpCode::CallI, location, location, 2, callSiteId);
}